

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ElemExpr *out_elem_expr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  Var *pVVar5;
  Type type;
  Location loc;
  Var var;
  Type local_14c;
  char *local_148;
  Var local_128;
  undefined1 local_d8 [12];
  undefined4 uStack_cc;
  anon_union_16_2_ecfd7102_for_Location_1 local_c8 [4];
  Enum local_88;
  Var local_78;
  
  GetToken((Token *)local_d8,this);
  local_148 = (char *)local_d8._0_8_;
  bVar1 = MatchLpar(this,Item);
  bVar2 = Match(this,Lpar);
  bVar3 = Match(this,RefNull);
  if (bVar3) {
    if (((this->options_->features).bulk_memory_enabled_ == false) &&
       ((this->options_->features).reference_types_enabled_ == false)) {
      Error(this,0x19b973);
    }
    RVar4 = ParseRefKind(this,&local_14c);
    if (RVar4.enum_ == Error) {
      return true;
    }
    pVVar5 = (Var *)(local_d8 + 8);
    local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
    local_128.loc.field_1.field_0.line = 0;
    local_128.loc.field_1._4_8_ = 0;
    local_128.loc.filename.data_ = (char *)0x0;
    local_128.loc.filename.size_._0_4_ = 0;
    local_128.loc.filename.size_._4_4_ = 0;
    Var::Var(pVVar5,0xffffffff,&local_128.loc);
    local_88 = local_14c.enum_;
    out_elem_expr->kind = local_d8._0_4_;
    Var::operator=(&out_elem_expr->var,pVVar5);
    (out_elem_expr->type).enum_ = local_88;
  }
  else {
    bVar3 = Match(this,RefFunc);
    if (!bVar3) {
      return false;
    }
    local_c8[0].field_0.line = 0;
    local_c8[0].field_0.first_column = 0;
    local_c8[0].field_0.last_column = 0;
    local_d8._0_8_ = (char *)0x0;
    local_d8._8_4_ = 0;
    uStack_cc = 0;
    Var::Var(&local_128,0xffffffff,(Location *)local_d8);
    RVar4 = ParseVar(this,&local_128);
    if (RVar4.enum_ == Error) {
      Var::~Var(&local_128);
      return true;
    }
    Var::Var(&local_78,&local_128);
    pVVar5 = (Var *)(local_d8 + 8);
    local_d8._0_4_ = 1;
    Var::Var(pVVar5,&local_78);
    out_elem_expr->kind = local_d8._0_4_;
    Var::operator=(&out_elem_expr->var,pVVar5);
    (out_elem_expr->type).enum_ = local_88;
    Var::~Var(pVVar5);
    Var::~Var(&local_78);
    pVVar5 = &local_128;
  }
  Var::~Var(pVVar5);
  if (bVar2) {
    RVar4 = Expect(this,Rpar);
    if (!bVar1 || RVar4.enum_ == Error) {
      return true;
    }
  }
  else if (!bVar1) {
    return true;
  }
  Expect(this,Rpar);
  return true;
}

Assistant:

bool WastParser::ParseElemExprOpt(ElemExpr* out_elem_expr) {
  Location loc = GetLocation();
  bool item = MatchLpar(TokenType::Item);
  bool lpar = Match(TokenType::Lpar);
  if (Match(TokenType::RefNull)) {
    if (!(options_->features.bulk_memory_enabled() ||
          options_->features.reference_types_enabled())) {
      Error(loc, "ref.null not allowed");
    }
    Type type;
    CHECK_RESULT(ParseRefKind(&type));
    *out_elem_expr = ElemExpr(type);
  } else if (Match(TokenType::RefFunc)) {
    Var var;
    CHECK_RESULT(ParseVar(&var));
    *out_elem_expr = ElemExpr(var);
  } else {
    return false;
  }
  if (lpar) {
    EXPECT(Rpar);
  }
  if (item) {
    EXPECT(Rpar);
  }
  return true;
}